

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_proj.c
# Opt level: O1

int CVodeSetProjErrEst(void *cvode_mem,int onoff)

{
  int iVar1;
  CVodeProjMem proj_mem;
  CVodeMem cv_mem;
  CVodeProjMem local_18;
  CVodeMem local_10;
  
  iVar1 = cvAccessProjMem(cvode_mem,"CVodeSetProjErrEst",&local_10,&local_18);
  if (iVar1 == 0) {
    local_18->err_proj = onoff;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVodeSetProjErrEst(void* cvode_mem, sunbooleantype onoff)
{
  int retval;
  CVodeMem cv_mem;
  CVodeProjMem proj_mem;

  /* Access memory structures */
  retval = cvAccessProjMem(cvode_mem, __func__, &cv_mem, &proj_mem);
  if (retval != CV_SUCCESS) { return (retval); }

  /* Set projection error flag */
  proj_mem->err_proj = onoff;

  return (CV_SUCCESS);
}